

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * safeGetline(string *__return_storage_ptr__,string *prompt)

{
  size_type sVar1;
  int iVar2;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    _readline(&local_40,prompt);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    while (sVar1 = __return_storage_ptr__->_M_string_length, sVar1 != 0) {
      iVar2 = isspace((int)(__return_storage_ptr__->_M_dataplus)._M_p[sVar1 - 1]);
      if (iVar2 == 0) {
        if (sVar1 != 0) {
          return __return_storage_ptr__;
        }
        break;
      }
      std::__cxx11::string::pop_back();
    }
  } while( true );
}

Assistant:

string safeGetline(const string &prompt = "")
{
    string s;
    while(s.empty())
    {
        s = _readline(prompt);
        while(s.size() && isspace(s.back()))
            s.pop_back();
    }
    return s;
}